

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

TEdge * __thiscall
ClipperLib::ClipperBase::ProcessBound(ClipperBase *this,TEdge *E,bool NextIsForward)

{
  long lVar1;
  long lVar2;
  TEdge *pTVar3;
  cInt cVar4;
  TEdge *pTVar5;
  TEdge **ppTVar6;
  TEdge *pTVar7;
  TEdge *pTVar8;
  value_type locMin;
  value_type local_30;
  
  if (E->OutIdx == -2) {
    pTVar5 = E;
    if (NextIsForward) {
      do {
        pTVar7 = pTVar5;
        pTVar5 = pTVar7->Next;
      } while ((pTVar7->Top).Y == (pTVar7->Next->Bot).Y);
      for (; ((pTVar7 != E && (pTVar7->Dx == -1e+40)) && (!NAN(pTVar7->Dx))); pTVar7 = pTVar7->Prev)
      {
      }
    }
    else {
      do {
        pTVar7 = pTVar5;
        pTVar5 = pTVar7->Prev;
      } while ((pTVar7->Top).Y == (pTVar7->Prev->Bot).Y);
      for (; ((pTVar7 != E && (pTVar7->Dx == -1e+40)) && (!NAN(pTVar7->Dx))); pTVar7 = pTVar7->Next)
      {
      }
    }
    if (pTVar7 != E) {
      local_30.RightBound = (&E->Next)[!NextIsForward];
      local_30.Y = ((local_30.RightBound)->Bot).Y;
      local_30.LeftBound = (TEdge *)0x0;
      (local_30.RightBound)->WindDelta = 0;
      pTVar5 = ProcessBound(this,local_30.RightBound,NextIsForward);
      std::vector<ClipperLib::LocalMinimum,_std::allocator<ClipperLib::LocalMinimum>_>::push_back
                (&this->m_MinimaList,&local_30);
      return pTVar5;
    }
    if (NextIsForward) {
      return pTVar7->Next;
    }
    return pTVar7->Prev;
  }
  if ((E->Dx == -1e+40) && (!NAN(E->Dx))) {
    pTVar5 = (&E->Next)[NextIsForward];
    lVar1 = (pTVar5->Bot).X;
    lVar2 = (E->Bot).X;
    if ((pTVar5->Dx == -1e+40) && (!NAN(pTVar5->Dx))) {
      if (lVar1 == lVar2) goto LAB_00113af2;
      lVar1 = (pTVar5->Top).X;
    }
    if (lVar1 != lVar2) {
      cVar4 = (E->Top).X;
      (E->Top).X = lVar2;
      (E->Bot).X = cVar4;
    }
  }
LAB_00113af2:
  pTVar5 = E;
  if (NextIsForward) {
    do {
      pTVar7 = pTVar5;
      pTVar5 = pTVar7->Next;
      if ((pTVar7->Top).Y != (pTVar5->Bot).Y) break;
    } while (pTVar5->OutIdx != -2);
    pTVar3 = E;
    if (((pTVar7->Dx == -1e+40) && (!NAN(pTVar7->Dx))) && (pTVar8 = pTVar7, pTVar5->OutIdx != -2)) {
      do {
        pTVar8 = pTVar8->Prev;
      } while (pTVar8->Dx == -1e+40);
      if ((pTVar5->Top).X < (pTVar8->Top).X) {
        pTVar7 = pTVar8;
      }
    }
    while (pTVar5 = pTVar3, pTVar5 != pTVar7) {
      pTVar3 = pTVar5->Next;
      pTVar5->NextInLML = pTVar3;
      if (((pTVar5 != E) && (pTVar5->Dx == -1e+40)) &&
         ((!NAN(pTVar5->Dx) && (lVar2 = (pTVar5->Bot).X, lVar2 != (pTVar5->Prev->Top).X)))) {
        cVar4 = (pTVar5->Top).X;
        (pTVar5->Top).X = lVar2;
        (pTVar5->Bot).X = cVar4;
      }
    }
    if (((pTVar7 != E) && (pTVar5->Dx == -1e+40)) &&
       ((!NAN(pTVar5->Dx) && (lVar2 = (pTVar5->Bot).X, lVar2 != (pTVar5->Prev->Top).X)))) {
      cVar4 = (pTVar5->Top).X;
      (pTVar5->Top).X = lVar2;
      (pTVar5->Bot).X = cVar4;
    }
    ppTVar6 = &pTVar7->Next;
  }
  else {
    do {
      pTVar7 = pTVar5;
      pTVar5 = pTVar7->Prev;
      if ((pTVar7->Top).Y != (pTVar5->Bot).Y) break;
    } while (pTVar5->OutIdx != -2);
    pTVar3 = E;
    if (((pTVar7->Dx == -1e+40) && (!NAN(pTVar7->Dx))) && (pTVar8 = pTVar7, pTVar5->OutIdx != -2)) {
      do {
        pTVar8 = pTVar8->Next;
      } while (pTVar8->Dx == -1e+40);
      if ((pTVar5->Top).X <= (pTVar8->Top).X) {
        pTVar7 = pTVar8;
      }
    }
    while (pTVar5 = pTVar3, pTVar5 != pTVar7) {
      pTVar3 = pTVar5->Prev;
      pTVar5->NextInLML = pTVar3;
      if (((pTVar5 != E) && (pTVar5->Dx == -1e+40)) &&
         ((!NAN(pTVar5->Dx) && (lVar2 = (pTVar5->Bot).X, lVar2 != (pTVar5->Next->Top).X)))) {
        cVar4 = (pTVar5->Top).X;
        (pTVar5->Top).X = lVar2;
        (pTVar5->Bot).X = cVar4;
      }
    }
    if (((pTVar7 != E) && (pTVar5->Dx == -1e+40)) &&
       ((!NAN(pTVar5->Dx) && (lVar2 = (pTVar5->Bot).X, lVar2 != (pTVar5->Next->Top).X)))) {
      cVar4 = (pTVar5->Top).X;
      (pTVar5->Top).X = lVar2;
      (pTVar5->Bot).X = cVar4;
    }
    ppTVar6 = &pTVar7->Prev;
  }
  return *ppTVar6;
}

Assistant:

TEdge* ClipperBase::ProcessBound(TEdge* E, bool NextIsForward)
{
  TEdge *Result = E;
  TEdge *Horz = 0;

  if (E->OutIdx == Skip)
  {
    //if edges still remain in the current bound beyond the skip edge then
    //create another LocMin and call ProcessBound once more
    if (NextIsForward)
    {
      while (E->Top.Y == E->Next->Bot.Y) E = E->Next;
      //don't include top horizontals when parsing a bound a second time,
      //they will be contained in the opposite bound ...
      while (E != Result && IsHorizontal(*E)) E = E->Prev;
    }
    else
    {
      while (E->Top.Y == E->Prev->Bot.Y) E = E->Prev;
      while (E != Result && IsHorizontal(*E)) E = E->Next;
    }

    if (E == Result)
    {
      if (NextIsForward) Result = E->Next;
      else Result = E->Prev;
    }
    else
    {
      //there are more edges in the bound beyond result starting with E
      if (NextIsForward)
        E = Result->Next;
      else
        E = Result->Prev;
      MinimaList::value_type locMin;
      locMin.Y = E->Bot.Y;
      locMin.LeftBound = 0;
      locMin.RightBound = E;
      E->WindDelta = 0;
      Result = ProcessBound(E, NextIsForward);
      m_MinimaList.push_back(locMin);
    }
    return Result;
  }

  TEdge *EStart;

  if (IsHorizontal(*E))
  {
    //We need to be careful with open paths because this may not be a
    //true local minima (ie E may be following a skip edge).
    //Also, consecutive horz. edges may start heading left before going right.
    if (NextIsForward) 
      EStart = E->Prev;
    else 
      EStart = E->Next;
    if (IsHorizontal(*EStart)) //ie an adjoining horizontal skip edge
      {
        if (EStart->Bot.X != E->Bot.X && EStart->Top.X != E->Bot.X)
          ReverseHorizontal(*E);
      }
      else if (EStart->Bot.X != E->Bot.X)
        ReverseHorizontal(*E);
  }
  
  EStart = E;
  if (NextIsForward)
  {
    while (Result->Top.Y == Result->Next->Bot.Y && Result->Next->OutIdx != Skip)
      Result = Result->Next;
    if (IsHorizontal(*Result) && Result->Next->OutIdx != Skip)
    {
      //nb: at the top of a bound, horizontals are added to the bound
      //only when the preceding edge attaches to the horizontal's left vertex
      //unless a Skip edge is encountered when that becomes the top divide
      Horz = Result;
      while (IsHorizontal(*Horz->Prev)) Horz = Horz->Prev;
      if (Horz->Prev->Top.X > Result->Next->Top.X) Result = Horz->Prev;
    }
    while (E != Result) 
    {
      E->NextInLML = E->Next;
      if (IsHorizontal(*E) && E != EStart &&
        E->Bot.X != E->Prev->Top.X) ReverseHorizontal(*E);
      E = E->Next;
    }
    if (IsHorizontal(*E) && E != EStart && E->Bot.X != E->Prev->Top.X) 
      ReverseHorizontal(*E);
    Result = Result->Next; //move to the edge just beyond current bound
  } else
  {
    while (Result->Top.Y == Result->Prev->Bot.Y && Result->Prev->OutIdx != Skip) 
      Result = Result->Prev;
    if (IsHorizontal(*Result) && Result->Prev->OutIdx != Skip)
    {
      Horz = Result;
      while (IsHorizontal(*Horz->Next)) Horz = Horz->Next;
      if (Horz->Next->Top.X == Result->Prev->Top.X ||
          Horz->Next->Top.X > Result->Prev->Top.X) Result = Horz->Next;
    }

    while (E != Result)
    {
      E->NextInLML = E->Prev;
      if (IsHorizontal(*E) && E != EStart && E->Bot.X != E->Next->Top.X) 
        ReverseHorizontal(*E);
      E = E->Prev;
    }
    if (IsHorizontal(*E) && E != EStart && E->Bot.X != E->Next->Top.X) 
      ReverseHorizontal(*E);
    Result = Result->Prev; //move to the edge just beyond current bound
  }

  return Result;
}